

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::OutputSimpleMesh
          (ChLoadContactSurfaceMesh *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_pos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_vel,
          vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *triangles)

{
  _Rb_tree_header *p_Var1;
  pointer pCVar2;
  pointer pCVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type mVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  unsigned_long uVar17;
  ulong uVar18;
  vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
  trilist;
  map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
  ptr_ind_map;
  vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
  local_b8;
  pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long> local_a0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *local_90;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *local_88;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_80;
  key_type local_78;
  key_type local_70;
  key_type local_68;
  _Rb_tree<chrono::fea::ChNodeFEAxyz_*,_std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>,_std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
  local_60;
  
  pCVar2 = (vert_pos->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((vert_pos->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (vert_pos->
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  pCVar2 = (vert_vel->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((vert_vel->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (vert_vel->
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  pCVar3 = (triangles->
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((triangles->super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
    (triangles->super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar3;
  }
  local_80 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)triangles;
  std::
  vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
  ::vector(&local_b8,
           &((this->contactmesh).
             super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->vfaces);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_b8.
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    uVar17 = 0;
    local_90 = vert_pos;
    local_88 = vert_vel;
    do {
      peVar4 = local_b8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar5 = (peVar4->mnode1).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (peVar4->mnode1).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      p_Var13 = &p_Var1->_M_header;
      p_Var16 = &p_Var1->_M_header;
      p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var12 = p_Var10;
          p_Var15 = p_Var16;
          peVar7 = *(element_type **)(p_Var12 + 1);
          p_Var16 = p_Var12;
          if (peVar7 < peVar5) {
            p_Var16 = p_Var15;
          }
          p_Var10 = (&p_Var12->_M_left)[peVar7 < peVar5];
        } while ((&p_Var12->_M_left)[peVar7 < peVar5] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 != p_Var1) {
          if (peVar7 < peVar5) {
            p_Var12 = p_Var15;
          }
          p_Var13 = p_Var16;
          if (peVar5 < *(element_type **)(p_Var12 + 1)) {
            p_Var13 = &p_Var1->_M_header;
          }
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if ((_Rb_tree_header *)p_Var13 == p_Var1) {
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a0.first =
             (peVar4->mnode1).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_a0.second = uVar17;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&local_60,&local_a0);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_90,(value_type *)&(peVar5->super_ChNodeFEAbase).field_0x20);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_88,(value_type *)&peVar5->field_0x38);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        uVar17 = uVar17 + 1;
      }
      peVar4 = local_b8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar5 = (peVar4->mnode2).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (peVar4->mnode2).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      p_Var13 = &p_Var1->_M_header;
      p_Var16 = &p_Var1->_M_header;
      p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var12 = p_Var10;
          p_Var15 = p_Var16;
          peVar7 = *(element_type **)(p_Var12 + 1);
          p_Var16 = p_Var12;
          if (peVar7 < peVar5) {
            p_Var16 = p_Var15;
          }
          p_Var10 = (&p_Var12->_M_left)[peVar7 < peVar5];
        } while ((&p_Var12->_M_left)[peVar7 < peVar5] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 != p_Var1) {
          if (peVar7 < peVar5) {
            p_Var12 = p_Var15;
          }
          p_Var13 = p_Var16;
          if (peVar5 < *(element_type **)(p_Var12 + 1)) {
            p_Var13 = &p_Var1->_M_header;
          }
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if ((_Rb_tree_header *)p_Var13 == p_Var1) {
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a0.first =
             (peVar4->mnode2).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_a0.second = uVar17;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&local_60,&local_a0);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_90,(value_type *)&(peVar5->super_ChNodeFEAbase).field_0x20);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_88,(value_type *)&peVar5->field_0x38);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        uVar17 = uVar17 + 1;
      }
      peVar4 = local_b8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar5 = (peVar4->mnode3).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (peVar4->mnode3).
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      p_Var13 = &p_Var1->_M_header;
      p_Var16 = &p_Var1->_M_header;
      p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var12 = p_Var10;
          p_Var15 = p_Var16;
          peVar7 = *(element_type **)(p_Var12 + 1);
          p_Var16 = p_Var12;
          if (peVar7 < peVar5) {
            p_Var16 = p_Var15;
          }
          p_Var10 = (&p_Var12->_M_left)[peVar7 < peVar5];
        } while ((&p_Var12->_M_left)[peVar7 < peVar5] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 != p_Var1) {
          if (peVar7 < peVar5) {
            p_Var12 = p_Var15;
          }
          p_Var13 = p_Var16;
          if (peVar5 < *(element_type **)(p_Var12 + 1)) {
            p_Var13 = &p_Var1->_M_header;
          }
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if ((_Rb_tree_header *)p_Var13 == p_Var1) {
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a0.first =
             (peVar4->mnode3).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_a0.second = uVar17;
        std::
        _Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>
                  ((_Rb_tree<chrono::fea::ChNodeFEAxyz*,std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>,std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>,std::less<chrono::fea::ChNodeFEAxyz*>,std::allocator<std::pair<chrono::fea::ChNodeFEAxyz*const,unsigned_long>>>
                    *)&local_60,&local_a0);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_90,(value_type *)&(peVar5->super_ChNodeFEAbase).field_0x20);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar4 = local_b8.
                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5 = (peVar4->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar4->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (local_88,(value_type *)&peVar5->field_0x38);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        uVar17 = uVar17 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)local_b8.
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_b8.
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 0;
    uVar18 = 0;
    do {
      lVar8 = *(long *)((long)&((local_b8.
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar14);
      local_68 = *(key_type *)(lVar8 + 0x30);
      p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x38);
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      pmVar11 = std::
                map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                ::at((map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                      *)&local_60,&local_68);
      lVar8 = *(long *)((long)&((local_b8.
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar14);
      local_90 = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
                 CONCAT44(local_90._4_4_,(int)*pmVar11);
      local_70 = *(key_type *)(lVar8 + 0x40);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x48);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pmVar11 = std::
                map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                ::at((map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                      *)&local_60,&local_70);
      mVar9 = *pmVar11;
      lVar8 = *(long *)((long)&((local_b8.
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar14);
      local_78 = *(key_type *)(lVar8 + 0x50);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x58);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      pmVar11 = std::
                map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                ::at((map<chrono::fea::ChNodeFEAxyz_*,_unsigned_long,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
                      *)&local_60,&local_78);
      local_a0.first = (ChNodeFEAxyz *)CONCAT44((int)mVar9,(int)local_90);
      local_a0.second = CONCAT44(local_a0.second._4_4_,(int)*pmVar11);
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      emplace_back<chrono::ChVector<int>>(local_80,(ChVector<int> *)&local_a0);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 0x10;
    } while (uVar18 < (ulong)((long)local_b8.
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::
  _Rb_tree<chrono::fea::ChNodeFEAxyz_*,_std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>,_std::_Select1st<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>,_std::less<chrono::fea::ChNodeFEAxyz_*>,_std::allocator<std::pair<chrono::fea::ChNodeFEAxyz_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void ChLoadContactSurfaceMesh::OutputSimpleMesh(std::vector<ChVector<>>& vert_pos,
                                                std::vector<ChVector<>>& vert_vel,
                                                std::vector<ChVector<int>>& triangles) {
    vert_pos.clear();
    vert_vel.clear();
    triangles.clear();
    size_t vertex_index = 0;
    auto trilist = this->contactmesh->GetTriangleList();
    // auxiliary map container to go from pointer-based mesh to index-based mesh:
    std::map<ChNodeFEAxyz*, size_t> ptr_ind_map;
    for (size_t i = 0; i < trilist.size(); ++i) {
        if (!ptr_ind_map.count(trilist[i]->GetNode1().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode1().get(), vertex_index});
            vert_pos.push_back(trilist[i]->GetNode1()->GetPos());
            vert_vel.push_back(trilist[i]->GetNode1()->GetPos_dt());
            ++vertex_index;
        }
        if (!ptr_ind_map.count(trilist[i]->GetNode2().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode2().get(), vertex_index});
            vert_pos.push_back(trilist[i]->GetNode2()->GetPos());
            vert_vel.push_back(trilist[i]->GetNode2()->GetPos_dt());
            ++vertex_index;
        }
        if (!ptr_ind_map.count(trilist[i]->GetNode3().get())) {
            ptr_ind_map.insert({trilist[i]->GetNode3().get(), vertex_index});
            vert_pos.push_back(trilist[i]->GetNode3()->GetPos());
            vert_vel.push_back(trilist[i]->GetNode3()->GetPos_dt());
            ++vertex_index;
        }
    }
    for (size_t i = 0; i < trilist.size(); ++i) {
        triangles.push_back(ChVector<int>((int)ptr_ind_map.at(trilist[i]->GetNode1().get()),
                                          (int)ptr_ind_map.at(trilist[i]->GetNode2().get()),
                                          (int)ptr_ind_map.at(trilist[i]->GetNode3().get())));
    }
}